

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_enc.c
# Opt level: O1

void VP8SetSegmentParams(VP8Encoder *enc,float quality)

{
  byte *pbVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  int *piVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  VP8Matrix *m;
  int iVar16;
  ulong uVar17;
  VP8SegmentInfo *pVVar18;
  bool bVar19;
  double dVar20;
  double dVar21;
  int map [4];
  byte local_48 [4];
  undefined4 uStack_44;
  undefined8 uStack_40;
  
  uVar5 = (enc->segment_hdr).num_segments;
  iVar16 = enc->config->sns_strength;
  dVar20 = (double)quality / 100.0;
  if (enc->config->emulate_jpeg_size == 0) {
    dVar20 = (double)(~-(ulong)(dVar20 < 0.75) & (ulong)(dVar20 + dVar20 + -1.0) |
                     (ulong)(dVar20 * 0.6666666666666666) & -(ulong)(dVar20 < 0.75));
    dVar21 = 0.3333333333333333;
  }
  else {
    dVar21 = (double)enc->alpha / 255.0;
    if (dVar21 <= 0.85) {
      dVar21 = (double)(~-(ulong)(dVar21 < 0.3) &
                        (ulong)((dVar21 + -0.3) * -0.9090909090909091 + 0.9) |
                       -(ulong)(dVar21 < 0.3) & 0x3feccccccccccccd);
    }
    else {
      dVar21 = 0.4;
    }
  }
  dVar20 = pow(dVar20,dVar21);
  if (0 < (int)uVar5) {
    lVar14 = 0;
    do {
      dVar21 = pow(dVar20,(double)*(int *)((long)&enc->dqm[0].alpha + lVar14) *
                          (((double)iVar16 * 0.9) / 100.0) * -0.0078125 + 1.0);
      iVar4 = (int)((1.0 - dVar21) * 127.0);
      if (0x7e < iVar4) {
        iVar4 = 0x7f;
      }
      if (iVar4 < 1) {
        iVar4 = 0;
      }
      *(int *)((long)&enc->dqm[0].quant + lVar14) = iVar4;
      lVar14 = lVar14 + 0x2e8;
    } while ((ulong)uVar5 * 0x2e8 - lVar14 != 0);
  }
  iVar16 = enc->dqm[0].quant;
  enc->base_quant = iVar16;
  if ((int)uVar5 < 4) {
    lVar14 = (long)(int)uVar5;
    piVar12 = &enc->dqm[lVar14].quant;
    do {
      lVar14 = lVar14 + 1;
      *piVar12 = iVar16;
      piVar12 = piVar12 + 0xba;
    } while ((int)lVar14 != 4);
  }
  iVar4 = (int)((ulong)((long)(enc->uv_alpha * 10 + -0x280) * -0x15f15f15) >> 0x20) +
          enc->uv_alpha * 10 + -0x280;
  iVar16 = enc->config->sns_strength;
  iVar4 = (iVar16 * ((iVar4 >> 6) - (iVar4 >> 0x1f))) / 100;
  iVar10 = 6;
  if (iVar4 < 6) {
    iVar10 = iVar4;
  }
  iVar4 = -4;
  if (-4 < iVar10) {
    iVar4 = iVar10;
  }
  iVar16 = (int)((ulong)((long)iVar16 * -0x51eb851f) >> 0x20);
  iVar10 = (iVar16 >> 3) - (iVar16 >> 0x1f);
  iVar16 = 0xf;
  if (iVar10 < 0xf) {
    iVar16 = iVar10;
  }
  iVar10 = -0xf;
  if (-0xf < iVar16) {
    iVar10 = iVar16;
  }
  enc->dq_y1_dc = 0;
  enc->dq_y2_dc = 0;
  enc->dq_y2_ac = 0;
  enc->dq_uv_dc = iVar10;
  enc->dq_uv_ac = iVar4;
  iVar16 = enc->config->filter_strength;
  lVar14 = 0x50c;
  do {
    uVar7 = *(uint *)((long)enc->parts + lVar14 + -0x74);
    if (0x7e < (int)uVar7) {
      uVar7 = 0x7f;
    }
    uVar17 = (ulong)uVar7;
    if ((int)uVar7 < 1) {
      uVar17 = 0;
    }
    iVar4 = VP8FilterStrengthFromDelta((enc->filter_hdr).sharpness,(uint)(kAcTable[uVar17] >> 2));
    iVar10 = (iVar4 * iVar16 * 5) / (*(int *)((long)enc->parts + lVar14 + -0x78) + 0x100);
    iVar4 = 0x3f;
    if (iVar10 < 0x3f) {
      iVar4 = iVar10;
    }
    if (iVar10 < 2) {
      iVar4 = 0;
    }
    *(int *)((long)enc->parts + lVar14 + -0x70) = iVar4;
    lVar14 = lVar14 + 0x2e8;
  } while (lVar14 != 0x10ac);
  (enc->filter_hdr).level = enc->dqm[0].fstrength;
  (enc->filter_hdr).simple = (uint)(enc->config->filter_type == 0);
  (enc->filter_hdr).sharpness = enc->config->filter_sharpness;
  if (1 < (int)uVar5) {
    _local_48 = 0x100000000;
    uStack_40 = 0x300000002;
    uVar5 = (enc->segment_hdr).num_segments;
    uVar7 = 4;
    if ((int)uVar5 < 4) {
      uVar7 = uVar5;
    }
    uVar17 = 1;
    if (1 < (int)uVar5) {
      uVar15 = 1;
      uVar17 = 1;
      do {
        iVar16 = (int)uVar17;
        pVVar18 = enc->dqm + uVar15;
        if (iVar16 < 1) {
          pbVar1 = local_48 + uVar15 * 4;
          pbVar1[0] = 0;
          pbVar1[1] = 0;
          pbVar1[2] = 0;
          pbVar1[3] = 0;
LAB_00138695:
          if (uVar15 != uVar17) {
            memcpy(enc->dqm + iVar16,pVVar18,0x2e8);
          }
          uVar17 = (ulong)(iVar16 + 1);
        }
        else {
          uVar8 = 0;
          bVar3 = false;
          piVar12 = &enc->dqm[0].fstrength;
          do {
            bVar19 = true;
            if (pVVar18->quant == piVar12[-1]) {
              bVar19 = pVVar18->fstrength != *piVar12;
            }
            if (!bVar19) {
              bVar3 = true;
              uVar9 = uVar8;
              break;
            }
            uVar8 = uVar8 + 1;
            piVar12 = piVar12 + 0xba;
            uVar9 = uVar17;
          } while (uVar17 != uVar8);
          *(int *)(local_48 + uVar15 * 4) = (int)uVar9;
          if (!bVar3) goto LAB_00138695;
        }
        uVar15 = uVar15 + 1;
      } while (uVar15 != uVar7);
    }
    iVar16 = (int)uVar17;
    if (iVar16 < (int)uVar7) {
      uVar5 = enc->mb_h * enc->mb_w;
      if (0 < (int)uVar5) {
        lVar14 = (ulong)uVar5 + 1;
        do {
          bVar2 = *(byte *)(enc->mb_info + lVar14 + -2);
          *(byte *)(enc->mb_info + lVar14 + -2) =
               bVar2 & 0x9f | (local_48[bVar2 >> 3 & 0xc] & 3) << 5;
          lVar14 = lVar14 + -1;
        } while (1 < lVar14);
      }
      (enc->segment_hdr).num_segments = iVar16;
      lVar14 = (long)(int)uVar7 - (long)iVar16;
      pVVar18 = enc->dqm + iVar16;
      do {
        memcpy(pVVar18,enc->dqm + (iVar16 + -1),0x2e8);
        pVVar18 = pVVar18 + 1;
        lVar14 = lVar14 + -1;
      } while (lVar14 != 0);
    }
  }
  iVar16 = 0;
  if (3 < enc->method) {
    iVar16 = enc->config->sns_strength;
  }
  lVar14 = (long)(enc->segment_hdr).num_segments;
  if (0 < lVar14) {
    m = &enc->dqm[0].y2;
    do {
      uVar5 = *(uint *)(m[2].q + 4);
      uVar7 = enc->dq_y1_dc + uVar5;
      if (0x7e < (int)uVar7) {
        uVar7 = 0x7f;
      }
      uVar17 = (ulong)uVar7;
      if ((int)uVar7 < 1) {
        uVar17 = 0;
      }
      uVar7 = 0x7f;
      if ((int)uVar5 < 0x7f) {
        uVar7 = uVar5;
      }
      if ((int)uVar7 < 1) {
        uVar7 = 0;
      }
      m[-1].q[0] = (ushort)kDcTable[uVar17];
      m[-1].q[1] = kAcTable[uVar7];
      uVar7 = enc->dq_y2_dc + uVar5;
      if (0x7e < (int)uVar7) {
        uVar7 = 0x7f;
      }
      uVar13 = 0;
      uVar17 = (ulong)uVar7;
      if ((int)uVar7 < 1) {
        uVar17 = 0;
      }
      m->q[0] = (ushort)kDcTable[uVar17] * 2;
      uVar7 = enc->dq_y2_ac + uVar5;
      if (0x7e < (int)uVar7) {
        uVar7 = 0x7f;
      }
      if ((int)uVar7 < 1) {
        uVar7 = uVar13;
      }
      m->q[1] = kAcTable2[uVar7];
      uVar7 = enc->dq_uv_dc + uVar5;
      if (0x74 < (int)uVar7) {
        uVar7 = 0x75;
      }
      if ((int)uVar7 < 1) {
        uVar7 = uVar13;
      }
      m[1].q[0] = (ushort)kDcTable[uVar7];
      uVar5 = uVar5 + enc->dq_uv_ac;
      if (0x7e < (int)uVar5) {
        uVar5 = 0x7f;
      }
      if ((int)uVar5 < 1) {
        uVar5 = uVar13;
      }
      m[1].q[1] = kAcTable[uVar5];
      iVar4 = ExpandMatrix(m + -1,0);
      iVar10 = ExpandMatrix(m,1);
      iVar6 = ExpandMatrix(m + 1,2);
      uVar5 = iVar4 * iVar4;
      iVar11 = (int)(uVar5 * 3) >> 7;
      *(int *)(m[2].q + 0xe) = iVar11;
      *(int *)(m[2].q + 0xc) = iVar10 * iVar10 * 3;
      *(int *)m[2].iq = iVar6 * iVar6 * 3 >> 6;
      *(uint *)(m[2].iq + 2) = uVar5 >> 7;
      *(int *)(m[2].iq + 10) = (int)(uVar5 * 7) >> 3;
      *(uint *)(m[2].iq + 8) = (uint)(iVar10 * iVar10) >> 2;
      *(int *)(m[2].iq + 0xc) = iVar6 * iVar6 * 2;
      *(int *)(m[2].iq + 6) = iVar4 * iVar16 >> 5;
      if (iVar11 < 1) {
        m[2].q[0xe] = 1;
        m[2].q[0xf] = 0;
      }
      if (*(int *)(m[2].q + 0xc) < 1) {
        m[2].q[0xc] = 1;
        m[2].q[0xd] = 0;
      }
      if (*(int *)m[2].iq < 1) {
        m[2].iq[0] = 1;
        m[2].iq[1] = 0;
      }
      if (*(int *)(m[2].iq + 2) < 1) {
        m[2].iq[2] = 1;
        m[2].iq[3] = 0;
      }
      if (*(int *)(m[2].iq + 10) < 1) {
        m[2].iq[10] = 1;
        m[2].iq[0xb] = 0;
      }
      if (*(int *)(m[2].iq + 8) < 1) {
        m[2].iq[8] = 1;
        m[2].iq[9] = 0;
      }
      if (*(int *)(m[2].iq + 0xc) < 1) {
        m[2].iq[0xc] = 1;
        m[2].iq[0xd] = 0;
      }
      if (*(int *)(m[2].iq + 6) < 1) {
        m[2].iq[6] = 1;
        m[2].iq[7] = 0;
      }
      *(uint *)(m[2].q + 10) = (uint)m[-1].q[0] * 0x14;
      m[2].q[8] = 0;
      m[2].q[9] = 0;
      *(long *)m[2].bias = (long)(int)(uVar5 * 1000);
      m = (VP8Matrix *)(m[3].bias + 2);
      lVar14 = lVar14 + -1;
    } while (lVar14 != 0);
  }
  return;
}

Assistant:

void VP8SetSegmentParams(VP8Encoder* const enc, float quality) {
  int i;
  int dq_uv_ac, dq_uv_dc;
  const int num_segments = enc->segment_hdr.num_segments;
  const double amp = SNS_TO_DQ * enc->config->sns_strength / 100. / 128.;
  const double Q = quality / 100.;
  const double c_base = enc->config->emulate_jpeg_size ?
      QualityToJPEGCompression(Q, enc->alpha / 255.) :
      QualityToCompression(Q);
  for (i = 0; i < num_segments; ++i) {
    // We modulate the base coefficient to accommodate for the quantization
    // susceptibility and allow denser segments to be quantized more.
    const double expn = 1. - amp * enc->dqm[i].alpha;
    const double c = pow(c_base, expn);
    const int q = (int)(127. * (1. - c));
    assert(expn > 0.);
    enc->dqm[i].quant = clip(q, 0, 127);
  }

  // purely indicative in the bitstream (except for the 1-segment case)
  enc->base_quant = enc->dqm[0].quant;

  // fill-in values for the unused segments (required by the syntax)
  for (i = num_segments; i < NUM_MB_SEGMENTS; ++i) {
    enc->dqm[i].quant = enc->base_quant;
  }

  // uv_alpha is normally spread around ~60. The useful range is
  // typically ~30 (quite bad) to ~100 (ok to decimate UV more).
  // We map it to the safe maximal range of MAX/MIN_DQ_UV for dq_uv.
  dq_uv_ac = (enc->uv_alpha - MID_ALPHA) * (MAX_DQ_UV - MIN_DQ_UV)
                                         / (MAX_ALPHA - MIN_ALPHA);
  // we rescale by the user-defined strength of adaptation
  dq_uv_ac = dq_uv_ac * enc->config->sns_strength / 100;
  // and make it safe.
  dq_uv_ac = clip(dq_uv_ac, MIN_DQ_UV, MAX_DQ_UV);
  // We also boost the dc-uv-quant a little, based on sns-strength, since
  // U/V channels are quite more reactive to high quants (flat DC-blocks
  // tend to appear, and are unpleasant).
  dq_uv_dc = -4 * enc->config->sns_strength / 100;
  dq_uv_dc = clip(dq_uv_dc, -15, 15);   // 4bit-signed max allowed

  enc->dq_y1_dc = 0;       // TODO(skal): dq-lum
  enc->dq_y2_dc = 0;
  enc->dq_y2_ac = 0;
  enc->dq_uv_dc = dq_uv_dc;
  enc->dq_uv_ac = dq_uv_ac;

  SetupFilterStrength(enc);   // initialize segments' filtering, eventually

  if (num_segments > 1) SimplifySegments(enc);

  SetupMatrices(enc);         // finalize quantization matrices
}